

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O0

FUNCTION_RETURN encode_pc_id(uchar *identifier1,uchar *identifier2,char *pc_identifier_out)

{
  size_t concatIdentifiersSize;
  char *pcStack_40;
  int b64_size;
  char *b64_data;
  undefined2 local_30;
  undefined1 auStack_2e [2];
  PcIdentifier concat_identifiers [2];
  char *pc_identifier_out_local;
  uchar *identifier2_local;
  uchar *identifier1_local;
  
  pcStack_40 = (char *)0x0;
  concatIdentifiersSize._4_4_ = 0;
  b64_data._4_4_ = *(undefined4 *)identifier1;
  local_30 = *(undefined2 *)(identifier1 + 4);
  _auStack_2e = *(undefined4 *)identifier2;
  concat_identifiers[0]._2_2_ = *(undefined2 *)(identifier2 + 4);
  concat_identifiers._4_8_ = pc_identifier_out;
  pcStack_40 = base64((void *)((long)&b64_data + 4),0xc,(int *)((long)&concatIdentifiersSize + 4));
  if (concatIdentifiersSize._4_4_ < 0x16) {
    sprintf((char *)concat_identifiers._4_8_,"%.4s-%.4s-%.4s-%.4s",pcStack_40,pcStack_40 + 4,
            pcStack_40 + 8,pcStack_40 + 0xc);
    free(pcStack_40);
    identifier1_local._4_4_ = FUNC_RET_OK;
  }
  else {
    free(pcStack_40);
    identifier1_local._4_4_ = FUNC_RET_BUFFER_TOO_SMALL;
  }
  return identifier1_local._4_4_;
}

Assistant:

FUNCTION_RETURN encode_pc_id(PcIdentifier identifier1, PcIdentifier identifier2,
		PcSignature pc_identifier_out) {
	//TODO base62 encoding, now uses base64
	PcIdentifier concat_identifiers[2];
	char* b64_data = NULL;
	int b64_size = 0;
	size_t concatIdentifiersSize = sizeof(PcIdentifier) * 2;
	//concat_identifiers = (PcIdentifier *) malloc(concatIdentifiersSize);
	memcpy(&concat_identifiers[0], identifier1, sizeof(PcIdentifier));
	memcpy(&concat_identifiers[1], identifier2, sizeof(PcIdentifier));
	b64_data = base64(concat_identifiers, concatIdentifiersSize, &b64_size);
	if (b64_size > sizeof(PcSignature)) {
		free(b64_data);
		return FUNC_RET_BUFFER_TOO_SMALL;
	}
	sprintf(pc_identifier_out, "%.4s-%.4s-%.4s-%.4s", &b64_data[0],
			&b64_data[4], &b64_data[8], &b64_data[12]);
	//free(concat_identifiers);
	free(b64_data);
	return FUNC_RET_OK;
}